

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::SyncRepeatedFieldWithMapNoLock
          (MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this)

{
  Arena *this_00;
  value_type *pvVar1;
  RepeatedPtrFieldBase *this_01;
  Message *f;
  MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *this_02;
  KeyMapEntryAccessorType *pKVar2;
  ValueMapEntryAccessorType *this_03;
  undefined1 local_48 [8];
  const_iterator it;
  
  this_01 = &((this->
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_01 == (RepeatedPtrFieldBase *)0x0) {
    this_00 = (this->
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
              ).super_MapFieldBase.arena_;
    if (this_00 == (Arena *)0x0) {
      this_01 = (RepeatedPtrFieldBase *)operator_new(0x18);
      ((RepeatedPtrFieldBase *)&this_01->arena_)->arena_ = (Arena *)0x0;
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->rep_ = (Rep *)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                       0x18);
      this_01 = (RepeatedPtrFieldBase *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&this_00->impl_,0x18,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                          );
      ((RepeatedPtrFieldBase *)&this_01->arena_)->arena_ = this_00;
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->rep_ = (Rep *)0x0;
    }
    (this->
    super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ).super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)this_01;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
            (this_01);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  ::begin((const_iterator *)local_48,&(this->impl_).map_);
  while (local_48 != (undefined1  [8])0x0) {
    f = (Message *)
        (**(code **)(_Struct_FieldsEntry_DoNotUse_default_instance_ + 0x20))
                  (&_Struct_FieldsEntry_DoNotUse_default_instance_,
                   (this->
                   super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                   ).super_MapFieldBase.arena_);
    this_02 = (MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
               *)down_cast<google::protobuf::Struct_FieldsEntry_DoNotUse*,google::protobuf::Message>
                           (f);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
              (this_01,this_02);
    pKVar2 = MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             ::mutable_key(this_02);
    std::__cxx11::string::_M_assign((string *)pKVar2);
    pvVar1 = ((KeyValuePair *)local_48)->v_;
    this_03 = MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
              ::mutable_value(this_02);
    Value::CopyFrom(this_03,&pvVar1->second);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
    ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                  *)local_48);
  }
  return;
}

Assistant:

void MapField<Derived, Key, T, kKeyFieldType, kValueFieldType,
              default_enum_value>::SyncRepeatedFieldWithMapNoLock() const {
  if (this->MapFieldBase::repeated_field_ == NULL) {
    if (this->MapFieldBase::arena_ == NULL) {
      this->MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      this->MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              this->MapFieldBase::arena_);
    }
  }
  const Map<Key, T>& map = impl_.GetMap();
  RepeatedPtrField<EntryType>* repeated_field =
      reinterpret_cast<RepeatedPtrField<EntryType>*>(
          this->MapFieldBase::repeated_field_);

  repeated_field->Clear();

  // The only way we can get at this point is through reflection and the
  // only way we can get the reflection object is by having called GetReflection
  // on the encompassing field. So that type must have existed and hence we
  // know that this MapEntry default_type has also already been constructed.
  // So it's safe to just call internal_default_instance().
  const Message* default_entry = Derived::internal_default_instance();
  for (typename Map<Key, T>::const_iterator it = map.begin(); it != map.end();
       ++it) {
    EntryType* new_entry =
        down_cast<EntryType*>(default_entry->New(this->MapFieldBase::arena_));
    repeated_field->AddAllocated(new_entry);
    (*new_entry->mutable_key()) = it->first;
    (*new_entry->mutable_value()) = it->second;
  }
}